

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O3

ScpServer * scp_recognise_exec(SshChannel *sc,SftpServerVtable *sftpserver_vt,ptrlen command)

{
  ptrlen whole;
  ptrlen whole_00;
  ptrlen whole_01;
  ptrlen whole_02;
  ptrlen whole_03;
  ptrlen whole_04;
  void *__src;
  size_t sVar1;
  undefined1 uVar2;
  _Bool _Var3;
  uint uVar4;
  undefined8 *puVar5;
  SftpServer *pSVar6;
  strbuf *psVar7;
  ScpError *pSVar8;
  undefined8 *puVar9;
  undefined1 uVar10;
  ScpServer *pSVar11;
  char *fmt;
  undefined1 uVar12;
  byte bVar13;
  undefined1 uVar14;
  ptrlen prefix;
  ptrlen prefix_00;
  ptrlen prefix_01;
  ptrlen prefix_02;
  ptrlen prefix_03;
  ptrlen prefix_04;
  ptrlen prefix_05;
  ptrlen local_68;
  SshChannel *local_58;
  void *local_50;
  SftpServerVtable *local_48;
  char *local_40;
  void *local_38;
  
  prefix.len = 4;
  prefix.ptr = "scp ";
  local_68.ptr = command.ptr;
  local_68.len = command.len;
  _Var3 = ptrlen_startswith(command,prefix,&local_68);
  if (_Var3) {
    uVar10 = 0;
    uVar12 = 0;
    uVar14 = 0;
    local_58 = sc;
    local_48 = sftpserver_vt;
    local_40 = (char *)command.len;
    local_38 = command.ptr;
    do {
      local_50 = (void *)CONCAT71(local_50._1_7_,uVar10);
      uVar10 = uVar12;
      uVar2 = uVar14;
      do {
        do {
          do {
            uVar14 = uVar2;
            uVar12 = uVar10;
            whole.len = local_68.len;
            whole.ptr = local_68.ptr;
            prefix_00.len = 3;
            prefix_00.ptr = "-v ";
            _Var3 = ptrlen_startswith(whole,prefix_00,&local_68);
            uVar10 = uVar12;
            uVar2 = uVar14;
          } while (_Var3);
          whole_00.len = local_68.len;
          whole_00.ptr = local_68.ptr;
          prefix_01.len = 3;
          prefix_01.ptr = "-r ";
          _Var3 = ptrlen_startswith(whole_00,prefix_01,&local_68);
          uVar2 = 1;
        } while (_Var3);
        whole_01.len = local_68.len;
        whole_01.ptr = local_68.ptr;
        prefix_02.len = 3;
        prefix_02.ptr = "-p ";
        _Var3 = ptrlen_startswith(whole_01,prefix_02,&local_68);
        uVar10 = 1;
        uVar2 = uVar14;
      } while (_Var3);
      whole_02.len = local_68.len;
      whole_02.ptr = local_68.ptr;
      prefix_03.len = 3;
      prefix_03.ptr = "-d ";
      _Var3 = ptrlen_startswith(whole_02,prefix_03,&local_68);
      uVar10 = 1;
    } while (_Var3);
    whole_03.len = local_68.len;
    whole_03.ptr = local_68.ptr;
    prefix_04.len = 3;
    prefix_04.ptr = "-t ";
    _Var3 = ptrlen_startswith(whole_03,prefix_04,&local_68);
    sVar1 = local_68.len;
    __src = local_68.ptr;
    whole_04.len = local_68.len;
    whole_04.ptr = local_68.ptr;
    if (_Var3) {
      puVar5 = (undefined8 *)safemalloc(1,0x168,0);
      memset(puVar5,0,0xe0);
      puVar5[0x2c] = &ScpSink_ScpServer_vt;
      puVar5[0x1c] = 0;
      puVar5[0x1d] = 0;
      puVar5[0x1e] = 0;
      puVar5[0x1f] = 0;
      puVar5[0x20] = 0;
      puVar5[0x21] = 0;
      puVar5[0x22] = 0;
      puVar5[0x23] = 0;
      puVar5[0x24] = 0;
      puVar5[0x25] = 0;
      puVar5[0x26] = 0;
      puVar5[0x27] = 0;
      puVar5[0x28] = 0;
      puVar5[0x29] = 0;
      puVar5[0x2a] = 0;
      puVar5[0x2b] = &ScpReplyReceiver_vt;
      puVar5[1] = local_58;
      pSVar6 = (*local_48->new)(local_48);
      *puVar5 = pSVar6;
      bufchain_init((bufchain *)(puVar5 + 8));
      psVar7 = strbuf_new();
      puVar5[0xe] = psVar7;
      psVar7 = strbuf_new();
      puVar5[0x10] = psVar7;
      bVar13 = 1;
      if (((ulong)local_50 & 1) == 0) {
        (**(code **)(*(long *)*puVar5 + 0x50))((long *)*puVar5,puVar5 + 0x2b,__src,sVar1,1);
        if ((*(char *)(puVar5 + 0x1c) == '\0') && ((*(byte *)(puVar5 + 0x1e) & 4) != 0)) {
          bVar13 = (byte)(*(uint *)(puVar5 + 0x22) >> 0xe) & 1;
        }
        else {
          bVar13 = 0;
        }
      }
      pSVar11 = (ScpServer *)(puVar5 + 0x2c);
      puVar9 = (undefined8 *)safemalloc(1,0x20,sVar1);
      puVar9[1] = puVar9 + 4;
      puVar9[2] = sVar1;
      memcpy(puVar9 + 4,__src,sVar1);
      *(byte *)(puVar9 + 3) = bVar13;
      *puVar9 = puVar5[2];
      puVar5[2] = puVar9;
      queue_toplevel_callback(scp_sink_start_callback,puVar5);
    }
    else {
      prefix_05.len = 3;
      prefix_05.ptr = "-f ";
      fmt = (char *)local_68.len;
      _Var3 = ptrlen_startswith(whole_04,prefix_05,&local_68);
      sVar1 = local_68.len;
      if (_Var3) {
        local_50 = local_68.ptr;
        puVar5 = (undefined8 *)safemalloc(1,0xe0,0);
        puVar5[2] = 0;
        puVar5[3] = 0;
        *puVar5 = 0;
        puVar5[1] = 0;
        puVar5[4] = 0;
        puVar5[5] = 0;
        puVar5[6] = 0;
        puVar5[7] = 0;
        puVar5[8] = 0;
        puVar5[9] = 0;
        puVar5[10] = 0;
        pSVar11 = (ScpServer *)(puVar5 + 0x1b);
        puVar5[0x1b] = &ScpSource_ScpServer_vt;
        puVar5[0xb] = 0;
        puVar5[0xc] = 0;
        puVar5[0xd] = 0;
        puVar5[0xe] = 0;
        puVar5[0xf] = 0;
        puVar5[0x10] = 0;
        puVar5[0x11] = 0;
        puVar5[0x12] = 0;
        puVar5[0x13] = 0;
        puVar5[0x14] = 0;
        puVar5[0x15] = 0;
        puVar5[0x16] = 0;
        puVar5[0x17] = 0;
        puVar5[0x18] = 0;
        puVar5[0x19] = 0;
        puVar5[0x1a] = &ScpReplyReceiver_vt;
        puVar5[2] = local_58;
        pSVar6 = (*local_48->new)(local_48);
        *puVar5 = pSVar6;
        *(undefined4 *)(puVar5 + 8) = 0;
        puVar9 = (undefined8 *)safemalloc(1,0x70,sVar1);
        local_58 = (SshChannel *)(puVar9 + 0xe);
        memcpy(local_58,local_50,sVar1);
        puVar9[2] = local_58;
        puVar9[3] = sVar1;
        puVar9[4] = (char *)(sVar1 + 0x70) + (long)puVar9;
        puVar9[5] = 0;
        puVar9[6] = 0;
        puVar9[7] = 0;
        puVar9[8] = 0;
        puVar9[9] = 0;
        puVar9[10] = 0;
        puVar9[0xb] = 0;
        puVar9[0xc] = 0;
        puVar9[0xd] = 0;
        *(undefined4 *)(puVar9 + 1) = 0;
        *puVar9 = puVar5[3];
        puVar5[3] = puVar9;
        *(undefined1 *)(puVar5 + 4) = uVar14;
        *(undefined1 *)((long)puVar5 + 0x21) = uVar12;
      }
      else {
        uVar4 = string_length_for_printf((size_t)local_40);
        pSVar8 = scp_error_new(local_58,fmt,(ulong)uVar4,local_38);
        pSVar11 = &pSVar8->scpserver;
      }
    }
  }
  else {
    pSVar11 = (ScpServer *)0x0;
  }
  return pSVar11;
}

Assistant:

ScpServer *scp_recognise_exec(
    SshChannel *sc, const SftpServerVtable *sftpserver_vt, ptrlen command)
{
    bool recursive = false, preserve = false;
    bool targetshouldbedirectory = false;
    ptrlen command_orig = command;

    if (!ptrlen_startswith(command, PTRLEN_LITERAL("scp "), &command))
        return NULL;

    while (1) {
        if (ptrlen_startswith(command, PTRLEN_LITERAL("-v "), &command)) {
            /* Enable verbose mode in the server, which we ignore */
            continue;
        }
        if (ptrlen_startswith(command, PTRLEN_LITERAL("-r "), &command)) {
            recursive = true;
            continue;
        }
        if (ptrlen_startswith(command, PTRLEN_LITERAL("-p "), &command)) {
            preserve = true;
            continue;
        }
        if (ptrlen_startswith(command, PTRLEN_LITERAL("-d "), &command)) {
            targetshouldbedirectory = true;
            continue;
        }
        break;
    }

    if (ptrlen_startswith(command, PTRLEN_LITERAL("-t "), &command)) {
        ScpSink *scp = scp_sink_new(sc, sftpserver_vt, command,
                                    targetshouldbedirectory);
        return &scp->scpserver;
    } else if (ptrlen_startswith(command, PTRLEN_LITERAL("-f "), &command)) {
        ScpSource *scp = scp_source_new(sc, sftpserver_vt, command);
        scp->recursive = recursive;
        scp->send_file_times = preserve;
        return &scp->scpserver;
    } else {
        ScpError *scp = scp_error_new(
            sc, "Unable to parse scp command: '%.*s'",
            PTRLEN_PRINTF(command_orig));
        return &scp->scpserver;
    }
}